

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O0

void __thiscall DIS::SeesPdu::marshal(SeesPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  undefined1 local_58 [8];
  VectoringNozzleSystem x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  PropulsionSystemData x;
  size_t idx;
  DataStream *dataStream_local;
  SeesPdu *this_local;
  
  DistributedEmissionsFamilyPdu::marshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::marshal(&this->_orginatingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_infraredSignatureRepresentationIndex);
  DataStream::operator<<(dataStream,this->_acousticSignatureRepresentationIndex);
  DataStream::operator<<(dataStream,this->_radarCrossSectionSignatureRepresentationIndex);
  sVar2 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::size
                    (&this->_propulsionSystemData);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  sVar2 = std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::size
                    (&this->_vectoringSystemData);
  DataStream::operator<<(dataStream,(unsigned_short)sVar2);
  x._powerSetting = 0.0;
  x._engineRpm = 0.0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::size
                      (&this->_propulsionSystemData);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::
             operator[](&this->_propulsionSystemData,x._8_8_);
    PropulsionSystemData::PropulsionSystemData((PropulsionSystemData *)local_30,pvVar3);
    PropulsionSystemData::marshal((PropulsionSystemData *)local_30,dataStream);
    PropulsionSystemData::~PropulsionSystemData((PropulsionSystemData *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  x_1._horizontalDeflectionAngle = 0.0;
  x_1._verticalDeflectionAngle = 0.0;
  while( true ) {
    uVar1 = x_1._8_8_;
    sVar2 = std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::
            size(&this->_vectoringSystemData);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::
             operator[](&this->_vectoringSystemData,x_1._8_8_);
    VectoringNozzleSystem::VectoringNozzleSystem((VectoringNozzleSystem *)local_58,pvVar4);
    VectoringNozzleSystem::marshal((VectoringNozzleSystem *)local_58,dataStream);
    VectoringNozzleSystem::~VectoringNozzleSystem((VectoringNozzleSystem *)local_58);
    x_1._8_8_ = x_1._8_8_ + 1;
  }
  return;
}

Assistant:

void SeesPdu::marshal(DataStream& dataStream) const
{
    DistributedEmissionsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _orginatingEntityID.marshal(dataStream);
    dataStream << _infraredSignatureRepresentationIndex;
    dataStream << _acousticSignatureRepresentationIndex;
    dataStream << _radarCrossSectionSignatureRepresentationIndex;
    dataStream << ( unsigned short )_propulsionSystemData.size();
    dataStream << ( unsigned short )_vectoringSystemData.size();

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        PropulsionSystemData x = _propulsionSystemData[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        VectoringNozzleSystem x = _vectoringSystemData[idx];
        x.marshal(dataStream);
     }

}